

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFVersion.cc
# Opt level: O0

bool __thiscall PDFVersion::operator<(PDFVersion *this,PDFVersion *rhs)

{
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  PDFVersion *rhs_local;
  PDFVersion *this_local;
  
  if (this->major_version < rhs->major_version) {
    local_21 = 1;
  }
  else {
    if (rhs->major_version < this->major_version) {
      local_22 = 0;
    }
    else {
      if (this->minor_version < rhs->minor_version) {
        local_23 = 1;
      }
      else {
        if (rhs->minor_version < this->minor_version) {
          local_24 = 0;
        }
        else {
          local_24 = -(this->extension_level < rhs->extension_level);
        }
        local_23 = local_24;
      }
      local_22 = local_23;
    }
    local_21 = local_22;
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool
PDFVersion::operator<(PDFVersion const& rhs) const
{
    return (
        (this->major_version < rhs.major_version)           ? true
            : (this->major_version > rhs.major_version)     ? false
            : (this->minor_version < rhs.minor_version)     ? true
            : (this->minor_version > rhs.minor_version)     ? false
            : (this->extension_level < rhs.extension_level) ? true
                                                            : false);
}